

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task18.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  time_t tVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  iVar5 = 100;
  iVar4 = -100;
  lVar6 = 0x50;
  while( true ) {
    if (lVar6 == 0) break;
    iVar1 = rand();
    iVar1 = iVar1 % 0xc9 + -100;
    if (iVar1 <= iVar5) {
      iVar5 = iVar1;
    }
    if (iVar4 <= iVar1) {
      iVar4 = iVar1;
    }
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::operator<<(poVar3,' ');
    lVar6 = lVar6 + -4;
  }
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int main(){
    int array[20] = {};
    int min = 100, max = -100;
    srand(time(NULL)); // сид для генерации задаем текущим верменем
    for (int &num: array){
        num = rand() % 201 - 100; // получаем числа в [0 - 100; 200 - 100]
        if (min > num) min = num;
        if (max < num) max = num;
        cout << num << ' ';
    }
    cout << endl << min << ' ' << max << endl;
    return 0;
}